

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

void __thiscall
glu::Shader::setSources(Shader *this,int numSourceStrings,char **sourceStrings,int *lengths)

{
  GLenum err;
  size_t sVar1;
  char *__s;
  ulong uVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (*this->m_gl->shaderSource)(this->m_shader,numSourceStrings,sourceStrings,lengths);
  err = (*this->m_gl->getError)();
  checkError(err,"glShaderSource()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x44);
  (this->m_info).source._M_string_length = 0;
  *(this->m_info).source._M_dataplus._M_p = '\0';
  if (0 < numSourceStrings) {
    uVar2 = 0;
    do {
      if ((lengths == (int *)0x0) || (sVar1 = (size_t)lengths[uVar2], (long)sVar1 < 0)) {
        __s = sourceStrings[uVar2];
        sVar1 = strlen(__s);
      }
      else {
        __s = sourceStrings[uVar2];
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,__s + sVar1);
      std::__cxx11::string::_M_append((char *)&(this->m_info).source,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)numSourceStrings != uVar2);
  }
  return;
}

Assistant:

void Shader::setSources (int numSourceStrings, const char* const* sourceStrings, const int* lengths)
{
	m_gl.shaderSource(m_shader, numSourceStrings, sourceStrings, lengths);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glShaderSource()");

	m_info.source.clear();
	for (int ndx = 0; ndx < numSourceStrings; ndx++)
	{
		const size_t length = lengths && lengths[ndx] >= 0 ? lengths[ndx] : strlen(sourceStrings[ndx]);
		m_info.source += std::string(sourceStrings[ndx], length);
	}
}